

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyClient.cpp
# Opt level: O0

bool __thiscall ProxyClient::start(ProxyClient *this)

{
  bool bVar1;
  uint uVar2;
  ProxyConfig *this_00;
  ulong uVar3;
  pointer pTVar4;
  undefined8 uVar5;
  pointer pCVar6;
  uv_loop_t *loop;
  _func_void_uv_timer_t_ptr *cb;
  int __fd;
  __2 local_4e2;
  anon_class_1_0_00000001 local_4e1;
  ClientRemoveSessionCall local_4e0;
  ProxyClient *local_4c0;
  code *local_4b8;
  undefined8 local_4b0;
  type local_4a8;
  ClientRecvCall local_490;
  ProxyClient *local_470;
  code *local_468;
  undefined8 local_460;
  type local_458;
  ClientDisconnectCall local_440;
  ProxyClient *local_420;
  code *local_418;
  undefined8 local_410;
  type local_408;
  ClientConnectCall local_3f0;
  anon_class_1_0_00000001 local_3c9;
  ClientCloseCall local_3c8;
  unique_ptr<net_uv::TCPClient,_std::default_delete<net_uv::TCPClient>_> local_3a8;
  unique_ptr<net_uv::KCPClient,_std::default_delete<net_uv::KCPClient>_> local_3a0;
  undefined8 local_398;
  unsigned_long local_390;
  undefined4 local_384;
  unique_ptr<Cypher,_std::default_delete<Cypher>_> local_380;
  undefined8 local_378;
  unsigned_long local_370;
  undefined4 local_364;
  unique_ptr<Cypher,_std::default_delete<Cypher>_> local_360;
  undefined8 local_358;
  unsigned_long local_350;
  undefined4 local_344;
  unique_ptr<Cypher,_std::default_delete<Cypher>_> local_340;
  ProxyClient *local_338;
  code *local_330;
  undefined8 local_328;
  type local_320;
  ServerDisconnectCall local_308;
  ProxyClient *local_2e8;
  code *local_2e0;
  undefined8 local_2d8;
  type local_2d0;
  ServerRecvCall local_2b8;
  ProxyClient *local_298;
  code *local_290;
  undefined8 local_288;
  type local_280;
  ServerNewConnectCall local_268;
  ProxyClient *local_248;
  code *local_240;
  undefined8 local_238;
  type local_230;
  ServerCloseCall local_218;
  unique_ptr<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_> local_1f8;
  undefined4 local_1f0;
  allocator<char> local_1e9;
  string local_1e8;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  string local_180;
  byte local_15a;
  byte local_159;
  uint32_t local_158;
  bool useKcp;
  uint32_t uStack_154;
  bool isipv6;
  uint32_t listenCount;
  uint32_t remotePort;
  uint32_t localPort;
  undefined1 local_128 [8];
  string remoteIP;
  string local_100;
  undefined1 local_e0 [8];
  string localIP;
  string local_b8;
  undefined1 local_98 [8];
  string encryKey;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string encryMethod;
  ProxyConfig *cfg;
  ProxyClient *this_local;
  
  if (this->m_runStatus == STOP) {
    this_00 = ProxyConfig::getInstance();
    encryMethod.field_2._8_8_ = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    ProxyConfig::getString((string *)local_40,this_00,"encry_method",&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    uVar5 = encryMethod.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"",(allocator<char> *)(localIP.field_2._M_local_buf + 0xf));
    ProxyConfig::getString((string *)local_98,(ProxyConfig *)uVar5,"encry_key",&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)(localIP.field_2._M_local_buf + 0xf));
    uVar5 = encryMethod.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"",(allocator<char> *)(remoteIP.field_2._M_local_buf + 0xf));
    ProxyConfig::getString((string *)local_e0,(ProxyConfig *)uVar5,"client_listenIP",&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)(remoteIP.field_2._M_local_buf + 0xf));
    uVar5 = encryMethod.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&localPort,"",(allocator<char> *)((long)&remotePort + 3));
    ProxyConfig::getString((string *)local_128,(ProxyConfig *)uVar5,"remoteIP",(string *)&localPort)
    ;
    std::__cxx11::string::~string((string *)&localPort);
    std::allocator<char>::~allocator((allocator<char> *)((long)&remotePort + 3));
    listenCount = ProxyConfig::getUInt32
                            ((ProxyConfig *)encryMethod.field_2._8_8_,"client_listenPort",0);
    uStack_154 = ProxyConfig::getUInt32((ProxyConfig *)encryMethod.field_2._8_8_,"svr_listenPort",0)
    ;
    local_158 = ProxyConfig::getUInt32
                          ((ProxyConfig *)encryMethod.field_2._8_8_,"client_listenCount",0xffff);
    local_159 = ProxyConfig::getBool((ProxyConfig *)encryMethod.field_2._8_8_,"is_ipv6",false);
    local_15a = ProxyConfig::getBool((ProxyConfig *)encryMethod.field_2._8_8_,"use_kcp",false);
    uVar5 = encryMethod.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"",&local_1a1);
    ProxyConfig::getString(&local_180,(ProxyConfig *)uVar5,"username",&local_1a0);
    std::__cxx11::string::operator=((string *)&this->m_username,(string *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    uVar5 = encryMethod.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"",&local_1e9);
    ProxyConfig::getString(&local_1c8,(ProxyConfig *)uVar5,"password",&local_1e8);
    std::__cxx11::string::operator=((string *)&this->m_password,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"RC4");
    if ((bVar1) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
      this_local._7_1_ = false;
    }
    else if ((((listenCount == 0) || (uStack_154 == 0)) || (local_158 == 0)) ||
            ((uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0 ||
             (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)))) {
      this_local._7_1_ = false;
    }
    else {
      std::__cxx11::string::operator=((string *)&this->m_remoteIP,(string *)local_128);
      this->m_remotePort = uStack_154;
      std::make_unique<net_uv::TCPServer>();
      std::unique_ptr<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>::operator=
                (&this->m_tcpSvr,&local_1f8);
      std::unique_ptr<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>::~unique_ptr
                (&local_1f8);
      pTVar4 = std::unique_ptr<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>::
               operator->(&this->m_tcpSvr);
      local_240 = on_tcp_ServerCloseCall;
      local_238 = 0;
      local_248 = this;
      std::bind<void(ProxyClient::*)(net_uv::Server*),ProxyClient*,std::_Placeholder<1>const&>
                (&local_230,(offset_in_ProxyClient_to_subr *)&local_240,&local_248,
                 (_Placeholder<1> *)&std::placeholders::_1);
      std::function<void(net_uv::Server*)>::
      function<std::_Bind<void(ProxyClient::*(ProxyClient*,std::_Placeholder<1>))(net_uv::Server*)>,void>
                ((function<void(net_uv::Server*)> *)&local_218,&local_230);
      net_uv::Server::setCloseCallback(&pTVar4->super_Server,&local_218);
      std::function<void_(net_uv::Server_*)>::~function(&local_218);
      pTVar4 = std::unique_ptr<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>::
               operator->(&this->m_tcpSvr);
      local_290 = on_tcp_ServerNewConnectCall;
      local_288 = 0;
      local_298 = this;
      std::
      bind<void(ProxyClient::*)(net_uv::Server*,net_uv::Session*),ProxyClient*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                (&local_280,(offset_in_ProxyClient_to_subr *)&local_290,&local_298,
                 (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2
                );
      std::function<void(net_uv::Server*,net_uv::Session*)>::
      function<std::_Bind<void(ProxyClient::*(ProxyClient*,std::_Placeholder<1>,std::_Placeholder<2>))(net_uv::Server*,net_uv::Session*)>,void>
                ((function<void(net_uv::Server*,net_uv::Session*)> *)&local_268,&local_280);
      net_uv::Server::setNewConnectCallback(&pTVar4->super_Server,&local_268);
      std::function<void_(net_uv::Server_*,_net_uv::Session_*)>::~function(&local_268);
      pTVar4 = std::unique_ptr<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>::
               operator->(&this->m_tcpSvr);
      local_2e0 = on_tcp_ServerRecvCall;
      local_2d8 = 0;
      local_2e8 = this;
      std::
      bind<void(ProxyClient::*)(net_uv::Server*,net_uv::Session*,char*,unsigned_int),ProxyClient*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&,std::_Placeholder<4>const&>
                (&local_2d0,(offset_in_ProxyClient_to_subr *)&local_2e0,&local_2e8,
                 (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2
                 ,(_Placeholder<3> *)&std::placeholders::_3,
                 (_Placeholder<4> *)&std::placeholders::_4);
      std::function<void(net_uv::Server*,net_uv::Session*,char*,unsigned_int)>::
      function<std::_Bind<void(ProxyClient::*(ProxyClient*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>))(net_uv::Server*,net_uv::Session*,char*,unsigned_int)>,void>
                ((function<void(net_uv::Server*,net_uv::Session*,char*,unsigned_int)> *)&local_2b8,
                 &local_2d0);
      net_uv::Server::setRecvCallback(&pTVar4->super_Server,&local_2b8);
      std::function<void_(net_uv::Server_*,_net_uv::Session_*,_char_*,_unsigned_int)>::~function
                (&local_2b8);
      pTVar4 = std::unique_ptr<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>::
               operator->(&this->m_tcpSvr);
      local_330 = on_tcp_ServerDisconnectCall;
      local_328 = 0;
      local_338 = this;
      std::
      bind<void(ProxyClient::*)(net_uv::Server*,net_uv::Session*),ProxyClient*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                (&local_320,(offset_in_ProxyClient_to_subr *)&local_330,&local_338,
                 (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2
                );
      std::function<void(net_uv::Server*,net_uv::Session*)>::
      function<std::_Bind<void(ProxyClient::*(ProxyClient*,std::_Placeholder<1>,std::_Placeholder<2>))(net_uv::Server*,net_uv::Session*)>,void>
                ((function<void(net_uv::Server*,net_uv::Session*)> *)&local_308,&local_320);
      net_uv::Server::setDisconnectCallback(&pTVar4->super_Server,&local_308);
      std::function<void_(net_uv::Server_*,_net_uv::Session_*)>::~function(&local_308);
      pTVar4 = std::unique_ptr<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>::
               operator->(&this->m_tcpSvr);
      uVar5 = std::__cxx11::string::c_str();
      uVar2 = (*(pTVar4->super_Server).super_Runnable._vptr_Runnable[6])
                        (pTVar4,uVar5,(ulong)listenCount,(ulong)(local_159 & 1),(ulong)local_158);
      if ((uVar2 & 1) == 0) {
        std::unique_ptr<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>::operator=
                  (&this->m_tcpSvr,(nullptr_t)0x0);
        this_local._7_1_ = false;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"RC4");
        if (bVar1) {
          local_344 = 2;
          local_350 = std::__cxx11::string::c_str();
          local_358 = std::__cxx11::string::size();
          std::make_unique<Cypher,EncryMethod,char_const*,unsigned_long>
                    ((EncryMethod *)&local_340,(char **)&local_344,&local_350);
          std::unique_ptr<Cypher,_std::default_delete<Cypher>_>::operator=
                    (&this->m_cypher,&local_340);
          std::unique_ptr<Cypher,_std::default_delete<Cypher>_>::~unique_ptr(&local_340);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"SNAPPY");
          if (bVar1) {
            local_364 = 3;
            local_370 = std::__cxx11::string::c_str();
            local_378 = std::__cxx11::string::size();
            std::make_unique<Cypher,EncryMethod,char_const*,unsigned_long>
                      ((EncryMethod *)&local_360,(char **)&local_364,&local_370);
            std::unique_ptr<Cypher,_std::default_delete<Cypher>_>::operator=
                      (&this->m_cypher,&local_360);
            std::unique_ptr<Cypher,_std::default_delete<Cypher>_>::~unique_ptr(&local_360);
          }
          else {
            local_384 = 1;
            local_390 = std::__cxx11::string::c_str();
            local_398 = std::__cxx11::string::size();
            std::make_unique<Cypher,EncryMethod,char_const*,unsigned_long>
                      ((EncryMethod *)&local_380,(char **)&local_384,&local_390);
            std::unique_ptr<Cypher,_std::default_delete<Cypher>_>::operator=
                      (&this->m_cypher,&local_380);
            std::unique_ptr<Cypher,_std::default_delete<Cypher>_>::~unique_ptr(&local_380);
          }
        }
        if ((local_15a & 1) == 0) {
          std::make_unique<net_uv::TCPClient>();
          std::unique_ptr<net_uv::Client,std::default_delete<net_uv::Client>>::operator=
                    ((unique_ptr<net_uv::Client,std::default_delete<net_uv::Client>> *)&this->m_pipe
                     ,&local_3a8);
          std::unique_ptr<net_uv::TCPClient,_std::default_delete<net_uv::TCPClient>_>::~unique_ptr
                    (&local_3a8);
        }
        else {
          std::make_unique<net_uv::KCPClient>();
          std::unique_ptr<net_uv::Client,std::default_delete<net_uv::Client>>::operator=
                    ((unique_ptr<net_uv::Client,std::default_delete<net_uv::Client>> *)&this->m_pipe
                     ,&local_3a0);
          std::unique_ptr<net_uv::KCPClient,_std::default_delete<net_uv::KCPClient>_>::~unique_ptr
                    (&local_3a0);
        }
        pCVar6 = std::unique_ptr<net_uv::Client,_std::default_delete<net_uv::Client>_>::operator->
                           (&this->m_pipe);
        std::function<void(net_uv::Client*)>::function<ProxyClient::start()::__0,void>
                  ((function<void(net_uv::Client*)> *)&local_3c8,&local_3c9);
        net_uv::Client::setClientCloseCallback(pCVar6,&local_3c8);
        std::function<void_(net_uv::Client_*)>::~function(&local_3c8);
        pCVar6 = std::unique_ptr<net_uv::Client,_std::default_delete<net_uv::Client>_>::operator->
                           (&this->m_pipe);
        local_418 = on_pipeConnectCallback;
        local_410 = 0;
        local_420 = this;
        std::
        bind<void(ProxyClient::*)(net_uv::Client*,net_uv::Session*,int),ProxyClient*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
                  (&local_408,(offset_in_ProxyClient_to_subr *)&local_418,&local_420,
                   (_Placeholder<1> *)&std::placeholders::_1,
                   (_Placeholder<2> *)&std::placeholders::_2,
                   (_Placeholder<3> *)&std::placeholders::_3);
        std::function<void(net_uv::Client*,net_uv::Session*,int)>::
        function<std::_Bind<void(ProxyClient::*(ProxyClient*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(net_uv::Client*,net_uv::Session*,int)>,void>
                  ((function<void(net_uv::Client*,net_uv::Session*,int)> *)&local_3f0,&local_408);
        net_uv::Client::setConnectCallback(pCVar6,&local_3f0);
        std::function<void_(net_uv::Client_*,_net_uv::Session_*,_int)>::~function(&local_3f0);
        pCVar6 = std::unique_ptr<net_uv::Client,_std::default_delete<net_uv::Client>_>::operator->
                           (&this->m_pipe);
        local_468 = on_pipeDisconnectCallback;
        local_460 = 0;
        local_470 = this;
        std::
        bind<void(ProxyClient::*)(net_uv::Client*,net_uv::Session*),ProxyClient*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                  (&local_458,(offset_in_ProxyClient_to_subr *)&local_468,&local_470,
                   (_Placeholder<1> *)&std::placeholders::_1,
                   (_Placeholder<2> *)&std::placeholders::_2);
        std::function<void(net_uv::Client*,net_uv::Session*)>::
        function<std::_Bind<void(ProxyClient::*(ProxyClient*,std::_Placeholder<1>,std::_Placeholder<2>))(net_uv::Client*,net_uv::Session*)>,void>
                  ((function<void(net_uv::Client*,net_uv::Session*)> *)&local_440,&local_458);
        net_uv::Client::setDisconnectCallback(pCVar6,&local_440);
        std::function<void_(net_uv::Client_*,_net_uv::Session_*)>::~function(&local_440);
        pCVar6 = std::unique_ptr<net_uv::Client,_std::default_delete<net_uv::Client>_>::operator->
                           (&this->m_pipe);
        local_4b8 = on_pipeRecvCallback;
        local_4b0 = 0;
        local_4c0 = this;
        std::
        bind<void(ProxyClient::*)(net_uv::Client*,net_uv::Session*,char*,unsigned_int),ProxyClient*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&,std::_Placeholder<4>const&>
                  (&local_4a8,(offset_in_ProxyClient_to_subr *)&local_4b8,&local_4c0,
                   (_Placeholder<1> *)&std::placeholders::_1,
                   (_Placeholder<2> *)&std::placeholders::_2,
                   (_Placeholder<3> *)&std::placeholders::_3,
                   (_Placeholder<4> *)&std::placeholders::_4);
        std::function<void(net_uv::Client*,net_uv::Session*,char*,unsigned_int)>::
        function<std::_Bind<void(ProxyClient::*(ProxyClient*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>))(net_uv::Client*,net_uv::Session*,char*,unsigned_int)>,void>
                  ((function<void(net_uv::Client*,net_uv::Session*,char*,unsigned_int)> *)&local_490
                   ,&local_4a8);
        net_uv::Client::setRecvCallback(pCVar6,&local_490);
        std::function<void_(net_uv::Client_*,_net_uv::Session_*,_char_*,_unsigned_int)>::~function
                  (&local_490);
        pCVar6 = std::unique_ptr<net_uv::Client,_std::default_delete<net_uv::Client>_>::operator->
                           (&this->m_pipe);
        std::function<void(net_uv::Client*,net_uv::Session*)>::
        function<ProxyClient::start()::__1,void>
                  ((function<void(net_uv::Client*,net_uv::Session*)> *)&local_4e0,&local_4e1);
        net_uv::Client::setRemoveSessionCallback(pCVar6,&local_4e0);
        std::function<void_(net_uv::Client_*,_net_uv::Session_*)>::~function(&local_4e0);
        this->m_runStatus = RUN;
        loop = net_uv::UVLoop::ptr(&this->m_loop);
        cb = start()::$_2::operator_cast_to_function_pointer(&local_4e2);
        net_uv::UVTimer::start(&this->m_update,loop,cb,1,1,this);
        __fd = 0;
        net_uv::UVLoop::run(&this->m_loop,UV_RUN_DEFAULT);
        net_uv::UVLoop::close(&this->m_loop,__fd);
        bVar1 = std::operator!=(&this->m_stopCall,(nullptr_t)0x0);
        if (bVar1) {
          std::function<void_()>::operator()(&this->m_stopCall);
          std::function<void_()>::operator=(&this->m_stopCall,(nullptr_t)0x0);
        }
        this_local._7_1_ = true;
      }
    }
    local_1f0 = 1;
    std::__cxx11::string::~string((string *)local_128);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)local_40);
    return this_local._7_1_;
  }
  __assert_fail("m_runStatus == RUN_STATUS::STOP",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/ProxyClient.cpp"
                ,0x18,"bool ProxyClient::start()");
}

Assistant:

bool ProxyClient::start()
{
	assert(m_runStatus == RUN_STATUS::STOP);

	auto cfg = ProxyConfig::getInstance();

	std::string encryMethod = cfg->getString("encry_method");
	std::string encryKey = cfg->getString("encry_key");
	std::string localIP = cfg->getString("client_listenIP");
	std::string remoteIP = cfg->getString("remoteIP");
	uint32_t localPort = cfg->getUInt32("client_listenPort");
	uint32_t remotePort = cfg->getUInt32("svr_listenPort");
	uint32_t listenCount = cfg->getUInt32("client_listenCount", 0xFFFF);
	bool isipv6 = cfg->getBool("is_ipv6", false);
	bool useKcp = cfg->getBool("use_kcp", false);

	m_username = cfg->getString("username");
	m_password = cfg->getString("password");

	if(encryMethod == "RC4" && encryKey.empty())
		return false;

	if(localPort == 0 || remotePort == 0 || listenCount == 0 || localIP.empty() || remoteIP.empty())
		return false;

	this->m_remoteIP = remoteIP;
	this->m_remotePort = remotePort;

	m_tcpSvr = std::make_unique<TCPServer>();
	m_tcpSvr->setCloseCallback(std::bind(&ProxyClient::on_tcp_ServerCloseCall, this, std::placeholders::_1));
	m_tcpSvr->setNewConnectCallback(std::bind(&ProxyClient::on_tcp_ServerNewConnectCall, this, std::placeholders::_1, std::placeholders::_2));
	m_tcpSvr->setRecvCallback(std::bind(&ProxyClient::on_tcp_ServerRecvCall, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3, std::placeholders::_4));
	m_tcpSvr->setDisconnectCallback(std::bind(&ProxyClient::on_tcp_ServerDisconnectCall, this, std::placeholders::_1, std::placeholders::_2));

	if (!m_tcpSvr->startServer(localIP.c_str(), localPort, isipv6, listenCount))
	{
		m_tcpSvr = NULL;
		return false;
	}

	if(encryMethod == "RC4")
		m_cypher = std::make_unique<Cypher>(EncryMethod::RC4, encryKey.c_str(), encryKey.size());
	else if(encryMethod == "SNAPPY")
		m_cypher = std::make_unique<Cypher>(EncryMethod::SNAPPY, encryKey.c_str(), encryKey.size());
	else
		m_cypher = std::make_unique<Cypher>(EncryMethod::NONE, encryKey.c_str(), encryKey.size());

	if(useKcp)
		m_pipe = std::make_unique<KCPClient>();
	else
		m_pipe = std::make_unique<TCPClient>();

	m_pipe->setClientCloseCallback([=](Client*){});
	m_pipe->setConnectCallback(std::bind(&ProxyClient::on_pipeConnectCallback, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3));
	m_pipe->setDisconnectCallback(std::bind(&ProxyClient::on_pipeDisconnectCallback, this, std::placeholders::_1, std::placeholders::_2));
	m_pipe->setRecvCallback(std::bind(&ProxyClient::on_pipeRecvCallback, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3, std::placeholders::_4));
	m_pipe->setRemoveSessionCallback([](Client*, Session* session) {});

	m_runStatus = RUN_STATUS::RUN;

	m_update.start(m_loop.ptr(), [](uv_timer_t* handle) 
	{
		auto self = (ProxyClient*)handle->data;
		self->updateFrame();
	}, 1, 1, this);
	m_loop.run(UV_RUN_DEFAULT);
	m_loop.close();

	if (m_stopCall != nullptr)
	{
		m_stopCall();
		m_stopCall = nullptr;
	}

	return true;
}